

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view action,
          MessageLite *message)

{
  string *extraout_RAX;
  string *psVar1;
  string_view sVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined1 local_b0 [32];
  undefined8 local_90;
  char *local_88;
  _anonymous_namespace_ *local_80;
  size_t local_78;
  undefined8 local_70;
  char *local_68;
  string_view local_60;
  undefined8 local_50;
  char *local_48;
  size_type local_40;
  string *local_38;
  
  sVar2 = MessageLite::GetTypeName((MessageLite *)action._M_str);
  MessageLite::InitializationErrorString_abi_cxx11_((string *)local_b0,(MessageLite *)action._M_str)
  ;
  local_90 = 6;
  local_88 = "Can\'t ";
  local_70 = 0x12;
  local_68 = " message of type \"";
  local_50 = 0x29;
  local_48 = "\" because it is missing required fields: ";
  local_40 = local_b0._8_8_;
  local_38 = (string *)local_b0._0_8_;
  pieces._M_len = local_b0._8_8_;
  pieces._M_array = (iterator)&DAT_00000006;
  local_80 = this;
  local_78 = action._M_len;
  local_60 = sVar2;
  absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_90,pieces);
  psVar1 = (string *)(local_b0 + 0x10);
  if ((string *)local_b0._0_8_ != psVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

std::string InitializationErrorMessage(absl::string_view action,
                                       const MessageLite& message) {
  return absl::StrCat("Can't ", action, " message of type \"",
                      message.GetTypeName(),
                      "\" because it is missing required fields: ",
                      message.InitializationErrorString());
}